

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

bool __thiscall doublechecked::Roaring::containsRange(Roaring *this,uint64_t x,uint64_t y)

{
  bool bVar1;
  reference puVar2;
  ulong in_RDX;
  ulong in_RSI;
  Roaring *in_RDI;
  bool bVar3;
  uint64_t last;
  const_iterator it;
  bool ans;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff98;
  _Self *in_stack_ffffffffffffffa0;
  uint7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  _Self local_48;
  ulong local_40;
  _Self local_38;
  undefined4 local_2c;
  _Self local_28;
  byte local_19;
  ulong local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_19 = roaring::Roaring::containsRange
                       (in_RDI,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                        (uint64_t)in_stack_ffffffffffffffa0);
  local_2c = (undefined4)local_10;
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                 (in_stack_ffffffffffffff98,(key_type *)0x10f94e);
  if (local_10 < local_18) {
    local_38._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (in_stack_ffffffffffffff98);
    bVar1 = std::operator==(&local_28,&local_38);
    if (bVar1) {
      _assert_true((unsigned_long)in_RDI,
                   (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                   (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                  );
    }
    else {
      local_40 = local_10;
      while( true ) {
        in_stack_ffffffffffffffa0 =
             std::_Rb_tree_const_iterator<unsigned_int>::operator++(in_stack_ffffffffffffffa0);
        local_48._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       (in_stack_ffffffffffffff98);
        bVar1 = std::operator!=(in_stack_ffffffffffffffa0,&local_48);
        bVar3 = false;
        if (bVar1) {
          in_stack_ffffffffffffff98 =
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               (local_40 + 1);
          puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                             ((_Rb_tree_const_iterator<unsigned_int> *)0x10fa4e);
          bVar3 = false;
          if (in_stack_ffffffffffffff98 ==
              (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
              (ulong)*puVar2) {
            puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                               ((_Rb_tree_const_iterator<unsigned_int> *)0x10fa6b);
            bVar3 = *puVar2 < local_18;
          }
        }
        if (!bVar3) break;
        puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x10fa8d);
        local_40 = (ulong)*puVar2;
      }
      _assert_true((unsigned_long)in_RDI,(char *)(ulong)in_stack_ffffffffffffffa8,
                   (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                  );
    }
  }
  else {
    _assert_true((unsigned_long)in_RDI,
                 (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                 (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool containsRange(const uint64_t x, const uint64_t y) const {
        bool ans = plain.containsRange(x, y);

        auto it = check.find(x);
        if (x >= y)
            assert_true(ans == true);  // roaring says true for this
        else if (it == check.end())
            assert_true(ans == false);  // start of range not in set
        else {
            uint64_t last = x;  // iterate up to y so long as values sequential
            while (++it != check.end() && last + 1 == *it && *it < y)
                last = *it;
            assert_true(ans == (last == y - 1));
        }

        return ans;
    }